

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

void dxil_spv::scrub_rov_lock_regions
               (CFGNode *node,bool preserve_first_begin,bool preserve_last_end)

{
  bool preserve_last_end_local;
  bool preserve_first_begin_local;
  CFGNode *node_local;
  
  scrub_rov_begin_lock(node,preserve_first_begin);
  scrub_rov_end_lock(node,preserve_last_end);
  return;
}

Assistant:

static void scrub_rov_lock_regions(CFGNode *node, bool preserve_first_begin, bool preserve_last_end)
{
	scrub_rov_begin_lock(node, preserve_first_begin);
	scrub_rov_end_lock(node, preserve_last_end);
}